

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_mirror(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *prVar5;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP SVar6;
  SP mat;
  undefined1 local_d0 [16];
  undefined1 local_c0 [64];
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::MirrorMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  lVar1 = *in_RDX;
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
  do {
    _Var2._M_pi = mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 8)) {
      mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"Kr");
    if (bVar3) {
      bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
      if (bVar3) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"mapping Kr for mirror materials not implemented");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      syntactic::ParamSet::getParam3f
                ((ParamSet *)*in_RDX,
                 &((mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->kr).x,&name);
    }
    else {
      bVar3 = std::operator==(&name,"bumpmap");
      if (bVar3) {
        syntactic::ParamSet::getParamTexture((ParamSet *)local_d0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)local_c0,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->map_bump).
                    super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_c0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
      }
      else {
        bVar3 = std::operator==(&name,"type");
        if (!bVar3) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_c0 + 0x20),"un-handled mirror-material parameter \'",&it.first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_c0 + 0x20),"\'");
          std::runtime_error::runtime_error(prVar5,(string *)local_c0);
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_mirror(pbrt::syntactic::Material::SP in)
  {
    MirrorMaterial::SP mat = std::make_shared<MirrorMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          throw std::runtime_error("mapping Kr for mirror materials not implemented");
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled mirror-material parameter '"+it.first+"'");
    };
    return mat;
  }